

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O1

void __thiscall nuraft::rpc_session::~rpc_session(rpc_session *this)

{
  _Atomic_word *p_Var1;
  element_type *peVar2;
  pointer pcVar3;
  _Manager_type p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  int iVar6;
  string local_30;
  
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    iVar6 = (**(code **)(*(long *)peVar2 + 0x38))();
    if (5 < iVar6) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&local_30,"asio rpc session destroyed: %p",this);
      (**(code **)(*(long *)peVar2 + 0x40))
                (peVar2,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"~rpc_session",0xf9,&local_30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p);
      }
    }
  }
  pcVar3 = (this->cached_address_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->cached_address_).field_2) {
    operator_delete(pcVar3);
  }
  p_Var4 = (this->callback_).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->callback_,(_Any_data *)&this->callback_,__destroy_functor);
  }
  p_Var5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  p_Var5 = (this->header_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  p_Var5 = (this->log_data_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  asio::ssl::detail::stream_core::~stream_core(&(this->ssl_socket_).core_);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  ~io_object_impl((io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                   *)&this->socket_);
  p_Var5 = (this->handler_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  p_Var5 = (this->super_enable_shared_from_this<nuraft::rpc_session>)._M_weak_this.
           super___weak_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var5->_M_weak_count;
      iVar6 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar6 = p_Var5->_M_weak_count;
      p_Var5->_M_weak_count = iVar6 + -1;
    }
    if (iVar6 == 1) {
      (*p_Var5->_vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

~rpc_session() {
        close_socket();
        p_tr("asio rpc session destroyed: %p", this);
    }